

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O2

void __thiscall ElfFile::loadSectionNames(ElfFile *this)

{
  byte bVar1;
  ElfSection *pEVar2;
  pointer ppEVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  string strName;
  allocator<char> local_49;
  string local_48 [32];
  
  uVar5 = (ulong)(this->fileHeader).e_shstrndx;
  if (uVar5 != 0) {
    ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      if ((ppEVar3[uVar5]->header).sh_size == uVar4) {
        for (uVar5 = 0;
            uVar5 < (ulong)((long)(this->sections).
                                  super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3);
            uVar5 = uVar5 + 1) {
          pEVar2 = ppEVar3[uVar5];
          if ((pEVar2->header).sh_type != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_48,(char *)((this->fileData).data_ +
                                        (int)((pEVar2->header).sh_name +
                                             (ppEVar3[(this->fileHeader).e_shstrndx]->header).
                                             sh_offset)),&local_49);
            std::__cxx11::string::_M_assign((string *)&pEVar2->name);
            std::__cxx11::string::~string(local_48);
            ppEVar3 = (this->sections).
                      super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
        }
        return;
      }
      bVar1 = (this->fileData).data_[uVar4 + (ppEVar3[uVar5]->header).sh_offset];
      uVar4 = uVar4 + 1;
    } while (bVar1 == '\0' || '\x1f' < (char)bVar1);
  }
  return;
}

Assistant:

void ElfFile::loadSectionNames()
{
	if (fileHeader.e_shstrndx == SHN_UNDEF) return;

	// check if the string table is actually a string table
	// sometimes it gives the wrong section id
	size_t strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
	size_t strTableSize = sections[fileHeader.e_shstrndx]->getSize();
	for (size_t i = 0; i < strTableSize; i++)
	{
		if (fileData[strTablePos+i] != 0 && fileData[strTablePos+i] < 0x20)
			return;
		if (fileData[strTablePos+i] > 0x7F)
			return;
	}

	for (size_t i = 0; i < sections.size(); i++)
	{
		ElfSection* section = sections[i];
		if (section->getType() == SHT_NULL) continue;

		int strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
		int offset = strTablePos+section->getNameOffset();

		char* name = (char*) fileData.data(offset);
		std::string strName = name;
		section->setName(strName);
	}
}